

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O2

void init_stb(void)

{
  if (init_stb()::done != '\0') {
    return;
  }
  std::mutex::lock(&init_stb::mutex);
  if (init_stb()::done == '\0') {
    stbi__init_zdefaults();
    init_stb()::done = '\x01';
  }
  pthread_mutex_unlock((pthread_mutex_t *)&init_stb::mutex);
  return;
}

Assistant:

static void init_stb()
{
  static bool done = false;
  static std::mutex mutex;

  if (!done)
  {
    mutex.lock();
    if (!done)
    {
      stbi__init_zdefaults();
      done = true;
    }
    mutex.unlock();
  }
}